

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O0

action __thiscall Search::predictor::predict(predictor *this)

{
  action aVar1;
  size_t sVar2;
  uint **ppuVar3;
  float **ppfVar4;
  size_t b;
  example *ec;
  action *unaff_RBX;
  search *in_RDI;
  size_t unaff_R14;
  float *unaff_R15;
  size_t unaff_retaddr;
  action p;
  size_t numAlA;
  float *alAcosts;
  action *alA;
  char *cNa;
  ptag *cOn;
  action *orA;
  char *in_stack_fffffffffffffef8;
  v_array<char> *in_stack_ffffffffffffff00;
  float in_stack_ffffffffffffff6c;
  search *oracle_actions;
  uint *puVar5;
  float weight;
  uint *condition_on;
  example *ecs;
  ptag in_stack_ffffffffffffffa4;
  search *this_00;
  uint *condition_on_names;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  search *condition_on_names_00;
  
  condition_on_names_00 = in_RDI;
  sVar2 = v_array<unsigned_int>::size((v_array<unsigned_int> *)&in_RDI->metatask_name);
  if (sVar2 == 0) {
    ecs = (example *)0x0;
  }
  else {
    ppuVar3 = v_array<unsigned_int>::begin((v_array<unsigned_int> *)&in_RDI->metatask_name);
    ecs = (example *)*ppuVar3;
  }
  sVar2 = v_array<char>::size((v_array<char> *)&in_RDI[2].task_name);
  if (sVar2 == 0) {
    condition_on = (uint *)0x0;
  }
  else {
    ppuVar3 = v_array<unsigned_int>::begin((v_array<unsigned_int> *)&in_RDI[1].metatask_name);
    condition_on = *ppuVar3;
  }
  sVar2 = v_array<char>::size((v_array<char> *)&in_RDI[2].task_name);
  if (sVar2 != 0) {
    in_stack_ffffffffffffffc7 = 0;
    v_array<char>::push_back(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    v_array<char>::begin((v_array<char> *)&in_RDI[2].task_name);
  }
  sVar2 = v_array<unsigned_int>::size((v_array<unsigned_int> *)&in_RDI[3].metatask_data);
  if (sVar2 == 0) {
    puVar5 = (uint *)0x0;
  }
  else {
    ppuVar3 = v_array<unsigned_int>::begin((v_array<unsigned_int> *)&in_RDI[3].metatask_data);
    puVar5 = *ppuVar3;
  }
  condition_on_names = puVar5;
  sVar2 = v_array<float>::size((v_array<float> *)&in_RDI[4].metatask_data);
  weight = (float)((ulong)puVar5 >> 0x20);
  if (sVar2 == 0) {
    oracle_actions = (search *)0x0;
  }
  else {
    ppfVar4 = v_array<float>::begin((v_array<float> *)&in_RDI[4].metatask_data);
    oracle_actions = (search *)*ppfVar4;
  }
  this_00 = oracle_actions;
  sVar2 = v_array<unsigned_int>::size((v_array<unsigned_int> *)&in_RDI[3].metatask_data);
  b = v_array<float>::size((v_array<float> *)&in_RDI[4].metatask_data);
  ec = (example *)max(sVar2,b);
  if (((ulong)in_RDI->priv & 1) == 0) {
    v_array<unsigned_int>::size((v_array<unsigned_int> *)&in_RDI->metatask_name);
    aVar1 = search::predict(this_00,ec,in_stack_ffffffffffffffa4,(action *)in_RDI,(size_t)ecs,
                            condition_on,(char *)condition_on_names_00,unaff_RBX,unaff_R14,unaff_R15
                            ,unaff_retaddr,weight);
  }
  else {
    v_array<unsigned_int>::size((v_array<unsigned_int> *)&in_RDI->metatask_name);
    aVar1 = search::predictLDF(in_RDI,ecs,(size_t)condition_on,(ptag)weight,(action *)oracle_actions
                               ,sVar2,(ptag *)this_00,(char *)condition_on_names,
                               CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
                               in_stack_ffffffffffffff6c);
  }
  sVar2 = v_array<char>::size((v_array<char> *)&in_RDI[2].task_name);
  if (sVar2 != 0) {
    v_array<char>::pop((v_array<char> *)&in_RDI[2].task_name);
  }
  return aVar1;
}

Assistant:

action predictor::predict()
{
  const action* orA = oracle_actions.size() == 0 ? nullptr : oracle_actions.begin();
  const ptag* cOn = condition_on_names.size() == 0 ? nullptr : condition_on_tags.begin();
  const char* cNa = nullptr;
  if (condition_on_names.size() > 0)
  {
    condition_on_names.push_back((char)0);  // null terminate
    cNa = condition_on_names.begin();
  }
  const action* alA = (allowed_actions.size() == 0) ? nullptr : allowed_actions.begin();
  const float* alAcosts = (allowed_actions_cost.size() == 0) ? nullptr : allowed_actions_cost.begin();
  size_t numAlA = max(allowed_actions.size(), allowed_actions_cost.size());
  action p = is_ldf
      ? sch.predictLDF(ec, ec_cnt, my_tag, orA, oracle_actions.size(), cOn, cNa, learner_id, weight)
      : sch.predict(*ec, my_tag, orA, oracle_actions.size(), cOn, cNa, alA, numAlA, alAcosts, learner_id, weight);

  if (condition_on_names.size() > 0)
    condition_on_names.pop();  // un-null-terminate
  return p;
}